

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location.hpp
# Opt level: O0

string * toml::detail::format_underline
                   (string *__return_storage_ptr__,string *message,
                   vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *loc_com,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *helps,bool colorize)

{
  value_type *pvVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  bool bVar2;
  __type_conflict1 _Var3;
  unsigned_long *puVar4;
  ulong uVar5;
  void *pvVar6;
  ostream *poVar7;
  const_reference pvVar8;
  string *psVar9;
  const_reference pvVar10;
  value_type *pvVar11;
  string *__rhs;
  reference pbVar12;
  char cVar13;
  bool local_2f2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *help;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string local_2a0;
  const_reference local_280;
  value_type *curr;
  value_type *prev;
  size_t i;
  anon_class_8_1_5e3eab80 local_248;
  anon_class_8_1_5e3eab80 format_one_location;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  ostringstream local_1e8 [8];
  ostringstream retval;
  unsigned_long local_70;
  unsigned_long local_68;
  size_t digit;
  reference ppStack_58;
  uint_least32_t line;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *lc;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  size_t line_num_width;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_28;
  bool colorize_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *helps_local;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *loc_com_local;
  string *message_local;
  
  __range2 = (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x0;
  line_num_width._7_1_ = colorize;
  pvStack_28 = helps;
  helps_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)loc_com;
  loc_com_local =
       (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)message;
  message_local = __return_storage_ptr__;
  __end2 = std::
           vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(loc_com);
  lc = (pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::end(loc_com);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)&lc), bVar2) {
    ppStack_58 = __gnu_cxx::
                 __normal_iterator<const_std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator*(&__end2);
    digit._4_4_ = source_location::line(&ppStack_58->first);
    local_68 = 0;
    for (; digit._4_4_ != 0; digit._4_4_ = digit._4_4_ / 10) {
      local_68 = local_68 + 1;
    }
    puVar4 = std::max<unsigned_long>((unsigned_long *)&__range2,&local_68);
    __range2 = (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)*puVar4;
    __gnu_cxx::
    __normal_iterator<const_std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end2);
  }
  local_70 = 1;
  puVar4 = std::max<unsigned_long>((unsigned_long *)&__range2,&local_70);
  __range2 = (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)*puVar4;
  std::__cxx11::ostringstream::ostringstream(local_1e8);
  bVar2 = color_ansi::should_color();
  if ((bVar2) || ((line_num_width._7_1_ & 1) != 0)) {
    std::ostream::operator<<(local_1e8,color_ansi::colorize);
  }
  uVar5 = std::__cxx11::string::size();
  local_2f2 = false;
  bVar2 = 7 < uVar5;
  if (bVar2) {
    uVar5 = 7;
    std::__cxx11::string::substr((ulong)&local_218,(ulong)loc_com_local);
    local_2f2 = std::operator==(&local_218,"[error]");
  }
  cVar13 = (char)uVar5;
  if (bVar2) {
    std::__cxx11::string::~string((string *)&local_218);
  }
  if (local_2f2 == false) {
    pvVar6 = (void *)std::ostream::operator<<(local_1e8,color_ansi::bold);
    poVar7 = (ostream *)std::ostream::operator<<(pvVar6,color_ansi::red);
    poVar7 = std::operator<<(poVar7,"[error] ");
    pvVar6 = (void *)std::ostream::operator<<(poVar7,color_ansi::reset);
    poVar7 = (ostream *)std::ostream::operator<<(pvVar6,color_ansi::bold);
    poVar7 = std::operator<<(poVar7,(string *)loc_com_local);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,color_ansi::reset);
    std::operator<<(poVar7,'\n');
  }
  else {
    pvVar6 = (void *)std::ostream::operator<<(local_1e8,color_ansi::bold);
    poVar7 = (ostream *)std::ostream::operator<<(pvVar6,color_ansi::red);
    poVar7 = std::operator<<(poVar7,"[error]");
    pvVar6 = (void *)std::ostream::operator<<(poVar7,color_ansi::reset);
    poVar7 = (ostream *)std::ostream::operator<<(pvVar6,color_ansi::bold);
    cVar13 = -1;
    std::__cxx11::string::substr((ulong)&format_one_location,(ulong)loc_com_local);
    poVar7 = std::operator<<(poVar7,(string *)&format_one_location);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,color_ansi::reset);
    std::operator<<(poVar7,'\n');
    std::__cxx11::string::~string((string *)&format_one_location);
  }
  local_248.line_num_width = (size_t)__range2;
  bVar2 = std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)helps_local);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    pvVar6 = (void *)std::ostream::operator<<(local_1e8,color_ansi::bold);
    poVar7 = (ostream *)std::ostream::operator<<(pvVar6,color_ansi::blue);
    poVar7 = std::operator<<(poVar7," --> ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,color_ansi::reset);
    pvVar8 = std::
             vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::front((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)helps_local);
    psVar9 = source_location::file_name_abi_cxx11_(&pvVar8->first);
    poVar7 = std::operator<<(poVar7,(string *)psVar9);
    std::operator<<(poVar7,'\n');
    make_string_abi_cxx11_
              ((string *)&i,
               (detail *)
               ((long)&(__range2->
                       super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + 1),0x20,cVar13);
    poVar7 = std::operator<<((ostream *)local_1e8,(string *)&i);
    pvVar6 = (void *)std::ostream::operator<<(poVar7,color_ansi::bold);
    poVar7 = (ostream *)std::ostream::operator<<(pvVar6,color_ansi::blue);
    poVar7 = std::operator<<(poVar7," |\n");
    std::ostream::operator<<(poVar7,color_ansi::reset);
    std::__cxx11::string::~string((string *)&i);
    pvVar8 = std::
             vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::front((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)helps_local);
    pvVar10 = std::
              vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::front((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)helps_local);
    format_underline::anon_class_8_1_5e3eab80::operator()
              (&local_248,(ostringstream *)local_1e8,&pvVar8->first,&pvVar10->second);
    for (prev = (value_type *)0x1; pvVar1 = prev,
        pvVar11 = (value_type *)
                  std::
                  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::size((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)helps_local), pvVar1 < pvVar11;
        prev = (value_type *)((long)&(prev->first).line_num_ + 1)) {
      curr = std::
             vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)helps_local,(size_type)((long)&prev[-1].second.field_2 + 0xf));
      cVar13 = (char)pvVar11;
      local_280 = std::
                  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::at((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)helps_local,(size_type)prev);
      std::operator<<((ostream *)local_1e8,'\n');
      psVar9 = source_location::file_name_abi_cxx11_(&curr->first);
      __rhs = source_location::file_name_abi_cxx11_(&local_280->first);
      _Var3 = std::operator==(psVar9,__rhs);
      if (_Var3) {
        pvVar6 = (void *)std::ostream::operator<<(local_1e8,color_ansi::bold);
        poVar7 = (ostream *)std::ostream::operator<<(pvVar6,color_ansi::blue);
        poVar7 = std::operator<<(poVar7," ...\n");
        std::ostream::operator<<(poVar7,color_ansi::reset);
      }
      else {
        pvVar6 = (void *)std::ostream::operator<<(local_1e8,color_ansi::bold);
        poVar7 = (ostream *)std::ostream::operator<<(pvVar6,color_ansi::blue);
        poVar7 = std::operator<<(poVar7," --> ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,color_ansi::reset);
        psVar9 = source_location::file_name_abi_cxx11_(&local_280->first);
        poVar7 = std::operator<<(poVar7,(string *)psVar9);
        std::operator<<(poVar7,'\n');
        make_string_abi_cxx11_
                  (&local_2a0,
                   (detail *)
                   ((long)&(__range2->
                           super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1),0x20,cVar13);
        poVar7 = std::operator<<((ostream *)local_1e8,(string *)&local_2a0);
        pvVar6 = (void *)std::ostream::operator<<(poVar7,color_ansi::bold);
        poVar7 = (ostream *)std::ostream::operator<<(pvVar6,color_ansi::blue);
        poVar7 = std::operator<<(poVar7," |\n");
        std::ostream::operator<<(poVar7,color_ansi::reset);
        std::__cxx11::string::~string((string *)&local_2a0);
      }
      format_underline::anon_class_8_1_5e3eab80::operator()
                (&local_248,(ostringstream *)local_1e8,&local_280->first,&local_280->second);
    }
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(pvStack_28);
    cVar13 = (char)pvVar11;
    if (!bVar2) {
      std::operator<<((ostream *)local_1e8,'\n');
      make_string_abi_cxx11_
                ((string *)&__range3,
                 (detail *)
                 ((long)&(__range2->
                         super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + 1),0x20,cVar13);
      std::operator<<((ostream *)local_1e8,(string *)&__range3);
      std::__cxx11::string::~string((string *)&__range3);
      pvVar6 = (void *)std::ostream::operator<<(local_1e8,color_ansi::bold);
      poVar7 = (ostream *)std::ostream::operator<<(pvVar6,color_ansi::blue);
      poVar7 = std::operator<<(poVar7," |");
      std::ostream::operator<<(poVar7,color_ansi::reset);
      this = pvStack_28;
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(pvStack_28);
      help = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(this);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&help), bVar2) {
        pbVar12 = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end3);
        poVar7 = (ostream *)std::ostream::operator<<(local_1e8,color_ansi::bold);
        poVar7 = std::operator<<(poVar7,"\nHint: ");
        std::ostream::operator<<(poVar7,color_ansi::reset);
        std::operator<<((ostream *)local_1e8,(string *)pbVar12);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
    }
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_1e8);
    return __return_storage_ptr__;
  }
  __assert_fail("!loc_com.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/toml11/toml/source_location.hpp"
                ,0xbc,
                "std::string toml::detail::format_underline(const std::string &, const std::vector<std::pair<source_location, std::string>> &, const std::vector<std::string> &, const bool)"
               );
}

Assistant:

inline std::string format_underline(const std::string& message,
        const std::vector<std::pair<source_location, std::string>>& loc_com,
        const std::vector<std::string>& helps = {},
        const bool colorize = TOML11_ERROR_MESSAGE_COLORIZED)
{
    std::size_t line_num_width = 0;
    for(const auto& lc : loc_com)
    {
        std::uint_least32_t line = lc.first.line();
        std::size_t        digit = 0;
        while(line != 0)
        {
            line  /= 10;
            digit +=  1;
        }
        line_num_width = (std::max)(line_num_width, digit);
    }
    // 1 is the minimum width
    line_num_width = std::max<std::size_t>(line_num_width, 1);

    std::ostringstream retval;

    if(color::should_color() || colorize)
    {
        retval << color::colorize; // turn on ANSI color
    }

    // XXX
    // Here, before `colorize` support, it does not output `[error]` prefix
    // automatically. So some user may output it manually and this change may
    // duplicate the prefix. To avoid it, check the first 7 characters and
    // if it is "[error]", it removes that part from the message shown.
    if(message.size() > 7 && message.substr(0, 7) == "[error]")
    {
        retval
#ifndef TOML11_NO_ERROR_PREFIX
               << color::bold << color::red << "[error]" << color::reset
#endif
               << color::bold << message.substr(7) << color::reset << '\n';
    }
    else
    {
        retval
#ifndef TOML11_NO_ERROR_PREFIX
               << color::bold << color::red << "[error] " << color::reset
#endif
               << color::bold << message << color::reset << '\n';
    }

    const auto format_one_location = [line_num_width]
        (std::ostringstream& oss,
         const source_location& loc, const std::string& comment) -> void
        {
            oss << ' ' << color::bold << color::blue
                << std::setw(static_cast<int>(line_num_width))
                << std::right << loc.line() << " | "  << color::reset
                << loc.line_str() << '\n';

            oss << make_string(line_num_width + 1, ' ')
                << color::bold << color::blue << " | " << color::reset
                << make_string(loc.column()-1 /*1-origin*/, ' ');

            if(loc.region() == 1)
            {
                // invalid
                // ^------
                oss << color::bold << color::red << "^---" << color::reset;
            }
            else
            {
                // invalid
                // ~~~~~~~
                const auto underline_len = (std::min)(
                    static_cast<std::size_t>(loc.region()), loc.line_str().size());
                oss << color::bold << color::red
                    << make_string(underline_len, '~') << color::reset;
            }
            oss << ' ';
            oss << comment;
            return;
        };

    assert(!loc_com.empty());

    // --> example.toml
    //   |
    retval << color::bold << color::blue << " --> " << color::reset
           << loc_com.front().first.file_name() << '\n';
    retval << make_string(line_num_width + 1, ' ')
           << color::bold << color::blue << " |\n"  << color::reset;
    // 1 | key value
    //   |    ^--- missing =
    format_one_location(retval, loc_com.front().first, loc_com.front().second);

    // process the rest of the locations
    for(std::size_t i=1; i<loc_com.size(); ++i)
    {
        const auto& prev = loc_com.at(i-1);
        const auto& curr = loc_com.at(i);

        retval << '\n';
        // if the filenames are the same, print "..."
        if(prev.first.file_name() == curr.first.file_name())
        {
            retval << color::bold << color::blue << " ...\n" << color::reset;
        }
        else // if filename differs, print " --> filename.toml" again
        {
            retval << color::bold << color::blue << " --> " << color::reset
                   << curr.first.file_name() << '\n';
            retval << make_string(line_num_width + 1, ' ')
                   << color::bold << color::blue << " |\n"  << color::reset;
        }

        format_one_location(retval, curr.first, curr.second);
    }

    if(!helps.empty())
    {
        retval << '\n';
        retval << make_string(line_num_width + 1, ' ');
        retval << color::bold << color::blue << " |" << color::reset;
        for(const auto& help : helps)
        {
            retval << color::bold << "\nHint: " << color::reset;
            retval << help;
        }
    }
    return retval.str();
}